

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O1

void createHuffmanTree(HuffmanTree *huffmanTree,int *w,int n)

{
  int iVar1;
  undefined8 in_RAX;
  HuffmanTree paVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int s2;
  int s1;
  undefined8 local_38;
  
  iVar7 = n * 2;
  local_38 = in_RAX;
  paVar2 = (HuffmanTree)malloc((long)iVar7 << 4);
  *huffmanTree = paVar2;
  if (0 < n) {
    lVar3 = 0;
    do {
      (&paVar2[1].weight)[lVar3] = *(uint *)((long)w + lVar3 + 4);
      *(undefined8 *)(&paVar2[1].parent + lVar3) = 0;
      (&paVar2[1].rchild)[lVar3] = 0;
      lVar3 = lVar3 + 4;
    } while ((ulong)(uint)n << 2 != lVar3);
  }
  iVar1 = n + 1;
  if (SBORROW4(iVar1,iVar7) != iVar1 + n * -2 < 0) {
    memset(paVar2 + iVar1,0,(ulong)(n - 2) * 0x10 + 0x10);
  }
  puts("\nHuffmanTree");
  if (SBORROW4(iVar1,iVar7) != iVar1 + n * -2 < 0) {
    uVar4 = (long)iVar1 << 4 | 0xc;
    iVar7 = n + -1;
    do {
      selecte(huffmanTree,n,(int *)((long)&local_38 + 4),(int *)&local_38);
      paVar2 = *huffmanTree;
      lVar3 = (long)local_38._4_4_;
      paVar2[lVar3].parent = 1;
      lVar6 = (long)(int)local_38;
      paVar2[lVar6].parent = 1;
      *(int *)((long)paVar2 + (uVar4 - 4)) = local_38._4_4_;
      *(int *)((long)&paVar2->weight + uVar4) = (int)local_38;
      uVar5 = paVar2[lVar6].weight + paVar2[lVar3].weight;
      *(uint *)((long)paVar2 + (uVar4 - 0xc)) = uVar5;
      printf("%d (%d,%d)\n",(ulong)uVar5,(ulong)paVar2[lVar3].weight,(ulong)paVar2[lVar6].weight);
      n = n + 1;
      uVar4 = uVar4 + 0x10;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  putchar(10);
  return;
}

Assistant:

void createHuffmanTree(HuffmanTree *huffmanTree,int w[],int n){
    //m为哈夫曼树总共的节点数，n为叶子结点数
    int m = 2 * n - 1;
    //s1和s2为当前结点里，要选取的最小权值结点
    int s1;
    int s2;
    //标记
    int i;
    //创建哈夫曼树的结点所需要的空间，m + 1,代表其中包含一个头结点
    *huffmanTree = (HuffmanTree)malloc((m + 1) * sizeof(Node));
    //1--n号放叶子节点，初始化叶子结点，初始的时候看做一个个单个结点的二叉树
    for(i = 1;i <= n;i++){
        //其中叶子结点的权值是w【n】数组来保存
        (*huffmanTree)[i].weight = w[i];
        //初始化叶子结点（单个二叉树）的孩子和双亲，单个节点，也就是没有孩子和双亲，==0
        (*huffmanTree)[i].lchild = 0;
        (*huffmanTree)[i].parent = 0;
        (*huffmanTree)[i].rchild = 0;
    }
    //非叶子结点的初始化
    for(int i = n + 1;i <= m;i++){
        (*huffmanTree)[i].weight = 0;
        (*huffmanTree)[i].lchild = 0;
        (*huffmanTree)[i].parent = 0;
        (*huffmanTree)[i].rchild = 0;
    }
    printf("\nHuffmanTree\n");
    //创建非叶子结点，建哈夫曼树
    for(i = n + 1;i <= m; i++){
        //在haffmantree【1】~huffmantree【i - 1】的范围内选择两个parent为0
        //且weight最小的结点，其序号分别为s1，s2
        selecte(huffmanTree,i - 1,&s1,&s2);
        //选出的两个权值最小的叶子结点，组成一个新的二叉树，根为i结点
        (*huffmanTree)[s1].parent = 1;
        (*huffmanTree)[s2].parent = 1;
        (*huffmanTree)[i].lchild = s1;
        (*huffmanTree)[i].rchild = s2;
        //新结点i的权值
        (*huffmanTree)[i].weight = (*huffmanTree)[s1].weight + (*huffmanTree)[s2].weight;
        printf("%d (%d,%d)\n",(*huffmanTree)[i].weight,(*huffmanTree)[s1].weight,(*huffmanTree)[s2].weight);
    }
    printf("\n");
}